

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void run(void)

{
  int local_4c;
  int local_48;
  int i;
  int path [16];
  
  for (local_4c = 0; local_4c < nodeNum; local_4c = local_4c + 1) {
    if ((0 < outDegrees[local_4c]) && (0 < inDegrees[local_4c])) {
      dfs_range1(local_4c,local_4c,1);
      dfs_range2(local_4c,local_4c,1);
      dfs(local_4c,local_4c,1,&local_48);
    }
  }
  return;
}

Assistant:

void run() {
    int path[16];
    for (int i = 0; i < nodeNum; ++i) {
        if (outDegrees[i] < 1 || inDegrees[i] < 1)continue;
        dfs_range1(i, i, 1);
        dfs_range2(i, i, 1);
        dfs(i, i, 1, path);
    }
}